

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

image_t * png_read(char *filename)

{
  char *pcVar1;
  FILE *__stream;
  FILE *__stream_00;
  int *piVar2;
  char *pcVar3;
  void *pvVar4;
  int local_ac;
  int local_a4;
  undefined1 local_88 [8];
  png_image png;
  image_t *image;
  FILE *stream;
  char *filename_local;
  
  memset(local_88,0,0x68);
  png.opaque._0_4_ = 1;
  __stream_00 = fopen(filename,"rb");
  __stream = _stderr;
  pcVar1 = argv0;
  if (__stream_00 == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(__stream,"%s: couldn\'t open %s for reading: %s\n",pcVar1,filename,pcVar3);
    exit(1);
  }
  png_image_begin_read_from_stdio((png_imagep)local_88,(FILE *)__stream_00);
  if (1 < (png.flags & 3)) {
    fprintf(_stderr,"%s: error reading %s: %s\n",argv0,filename,&png.colormap_entries);
    exit(1);
  }
  png.width = 3;
  png._96_8_ = malloc(0x18);
  *(int *)(png._96_8_ + 8) = png.opaque._4_4_;
  *(png_uint_32 *)(png._96_8_ + 0xc) = png.version;
  *(undefined4 *)(png._96_8_ + 0x10) = 0xffffffff;
  if ((png.width & 8) == 0) {
    local_a4 = ((png.width & 4) >> 2) + 1;
  }
  else {
    local_a4 = 1;
  }
  if ((png.width & 8) == 0) {
    local_ac = (png.width & 3) + 1;
  }
  else {
    local_ac = 1;
  }
  pvVar4 = malloc((ulong)(local_a4 * png.version * local_ac * png.opaque._4_4_));
  *(void **)png._96_8_ = pvVar4;
  png_image_finish_read
            ((png_imagep)local_88,(png_const_colorp)0x0,*(void **)png._96_8_,0,(void *)0x0);
  if (1 < (png.flags & 3)) {
    fprintf(_stderr,"%s: error reading %s: %s\n",argv0,filename,&png.colormap_entries);
    exit(1);
  }
  fclose(__stream_00);
  return (image_t *)png._96_8_;
}

Assistant:

image_t*
png_read(
    const char* filename)
{
    FILE* stream;
    image_t* image;
    png_image png = {
        .version = PNG_IMAGE_VERSION,
        .opaque = NULL
    };

    stream = fopen(filename, "rb");
    if(!stream) {
        fprintf(stderr, "%s: couldn't open %s for reading: %s\n",
            argv0, filename, strerror(errno));
        exit(1);
    }

#define ERR_WRAP(x) \
    x; \
    if(PNG_IMAGE_FAILED(png)) { \
        fprintf(stderr, "%s: error reading %s: %s\n", \
            argv0, filename, png.message); \
        exit(1); \
    }

    ERR_WRAP(png_image_begin_read_from_stdio(&png, stream));
    png.format = PNG_FORMAT_RGBA;

    image = malloc(sizeof(image_t));
    image->width = png.width;
    image->height = png.height;
    image->format = FORMAT_RGBA8888;
    image->data = malloc(PNG_IMAGE_SIZE(png));

    ERR_WRAP(png_image_finish_read(&png, 0, image->data, 0, NULL));
    fclose(stream);

#undef ERR_WRAP

    return image;
}